

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetFilenameComponentCommand.cxx
# Opt level: O0

bool __thiscall
cmGetFilenameComponentCommand::InitialPass
          (cmGetFilenameComponentCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmMakefile *pcVar1;
  bool bVar2;
  byte bVar3;
  size_type sVar4;
  const_reference pvVar5;
  long lVar6;
  string *psVar7;
  const_reference __lhs;
  ulong uVar8;
  char *pcVar9;
  undefined1 local_320 [8];
  string err;
  string local_2e0;
  uint local_2bc;
  undefined1 local_2b8 [4];
  uint i_1;
  string baseDir;
  string local_278;
  string local_258;
  string local_238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  string local_1f8;
  undefined1 local_1d8 [8];
  string program;
  string local_198;
  string local_178;
  uint local_154;
  undefined1 local_150 [4];
  uint i;
  string local_130;
  undefined1 local_110 [8];
  string programArgs;
  string storeArgs;
  string other;
  KeyWOW64 other_view;
  KeyWOW64 view;
  string filename;
  string result;
  char *cacheValue;
  allocator<char> local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmGetFilenameComponentCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar4 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local._7_1_ = 0;
    goto LAB_002f93e6;
  }
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)param_2_local);
  if (3 < sVar4) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)param_2_local);
    bVar2 = std::operator==(pvVar5,"CACHE");
    if (bVar2) {
      pcVar1 = (this->super_cmCommand).Makefile;
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)param_2_local);
      pcVar9 = cmMakefile::GetDefinition(pcVar1,pvVar5);
      if ((pcVar9 != (char *)0x0) && (bVar2 = cmSystemTools::IsNOTFOUND(pcVar9), !bVar2)) {
        this_local._7_1_ = 1;
        goto LAB_002f93e6;
      }
    }
  }
  std::__cxx11::string::string((string *)(filename.field_2._M_local_buf + 8));
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local,1);
  std::__cxx11::string::string((string *)&other_view,(string *)pvVar5);
  lVar6 = std::__cxx11::string::find((char *)&other_view,0x7a7cb7);
  if (lVar6 != -1) {
    other.field_2._12_4_ = 1;
    other.field_2._8_4_ = 2;
    bVar2 = cmMakefile::PlatformIs64Bit((this->super_cmCommand).Makefile);
    if (bVar2) {
      other.field_2._12_4_ = 2;
      other.field_2._8_4_ = 1;
    }
    cmSystemTools::ExpandRegistryValues((string *)&other_view,other.field_2._12_4_);
    lVar6 = std::__cxx11::string::find((char *)&other_view,0x79d9bc);
    if (lVar6 != -1) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,1);
      std::__cxx11::string::string((string *)(storeArgs.field_2._M_local_buf + 8),(string *)pvVar5);
      cmSystemTools::ExpandRegistryValues
                ((string *)((long)&storeArgs.field_2 + 8),other.field_2._8_4_);
      lVar6 = std::__cxx11::string::find(storeArgs.field_2._M_local_buf + 8,0x79d9bc);
      if (lVar6 == -1) {
        std::__cxx11::string::operator=
                  ((string *)&other_view,(string *)(storeArgs.field_2._M_local_buf + 8));
      }
      std::__cxx11::string::~string((string *)(storeArgs.field_2._M_local_buf + 8));
    }
  }
  std::__cxx11::string::string((string *)(programArgs.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_110);
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local,2);
  bVar2 = std::operator==(pvVar5,"DIRECTORY");
  if (bVar2) {
LAB_002f8910:
    cmsys::SystemTools::GetFilenamePath(&local_130,(string *)&other_view);
    std::__cxx11::string::operator=
              ((string *)(filename.field_2._M_local_buf + 8),(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
LAB_002f915b:
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local);
    if (sVar4 < 4) {
LAB_002f92dd:
      uVar8 = std::__cxx11::string::empty();
      if (((uVar8 & 1) == 0) && (uVar8 = std::__cxx11::string::empty(), (uVar8 & 1) == 0)) {
        pcVar1 = (this->super_cmCommand).Makefile;
        pcVar9 = (char *)std::__cxx11::string::c_str();
        cmMakefile::AddDefinition(pcVar1,(string *)((long)&programArgs.field_2 + 8),pcVar9);
      }
      pcVar1 = (this->super_cmCommand).Makefile;
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)param_2_local);
      pcVar9 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(pcVar1,pvVar5,pcVar9);
    }
    else {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)param_2_local);
      bVar2 = std::operator==(pvVar5,"CACHE");
      if (!bVar2) goto LAB_002f92dd;
      uVar8 = std::__cxx11::string::empty();
      if (((uVar8 & 1) == 0) && (uVar8 = std::__cxx11::string::empty(), (uVar8 & 1) == 0)) {
        pcVar1 = (this->super_cmCommand).Makefile;
        pcVar9 = (char *)std::__cxx11::string::c_str();
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local,2);
        bVar2 = std::operator==(pvVar5,"PATH");
        cmMakefile::AddCacheDefinition
                  (pcVar1,(string *)((long)&programArgs.field_2 + 8),pcVar9,"",bVar2 ^ STRING,false)
        ;
      }
      pcVar1 = (this->super_cmCommand).Makefile;
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)param_2_local);
      pcVar9 = (char *)std::__cxx11::string::c_str();
      __lhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)param_2_local,2);
      bVar2 = std::operator==(__lhs,"PATH");
      cmMakefile::AddCacheDefinition(pcVar1,pvVar5,pcVar9,"",bVar2 ^ STRING,false);
    }
    this_local._7_1_ = 1;
  }
  else {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,2);
    bVar2 = std::operator==(pvVar5,"PATH");
    if (bVar2) goto LAB_002f8910;
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,2);
    bVar2 = std::operator==(pvVar5,"NAME");
    if (bVar2) {
      cmsys::SystemTools::GetFilenameName((string *)local_150,(string *)&other_view);
      std::__cxx11::string::operator=
                ((string *)(filename.field_2._M_local_buf + 8),(string *)local_150);
      std::__cxx11::string::~string((string *)local_150);
      goto LAB_002f915b;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,2);
    bVar2 = std::operator==(pvVar5,"PROGRAM");
    if (bVar2) {
      for (local_154 = 2; uVar8 = (ulong)local_154,
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)param_2_local), uVar8 < sVar4; local_154 = local_154 + 1) {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local,(ulong)local_154);
        bVar2 = std::operator==(pvVar5,"PROGRAM_ARGS");
        if (bVar2) {
          local_154 = local_154 + 1;
          uVar8 = (ulong)local_154;
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)param_2_local);
          if (uVar8 < sVar4) {
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)param_2_local,(ulong)local_154);
            std::__cxx11::string::operator=
                      ((string *)(programArgs.field_2._M_local_buf + 8),(string *)pvVar5);
          }
        }
      }
      cmSystemTools::TrimWhitespace(&local_178,(string *)&other_view);
      bVar3 = std::__cxx11::string::empty();
      std::__cxx11::string::~string((string *)&local_178);
      if (((bVar3 ^ 0xff) & 1) != 0) {
        program.field_2._8_8_ = 0;
        this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&program.field_2 + 8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(this_00);
        cmsys::SystemTools::FindProgram(&local_198,(string *)&other_view,this_00,false);
        std::__cxx11::string::operator=
                  ((string *)(filename.field_2._M_local_buf + 8),(string *)&local_198);
        std::__cxx11::string::~string((string *)&local_198);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&program.field_2 + 8));
      }
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) != 0) {
        std::__cxx11::string::string((string *)local_1d8);
        bVar2 = cmSystemTools::SplitProgramFromArgs
                          ((string *)&other_view,(string *)local_1d8,(string *)local_110);
        if (bVar2) {
          bVar2 = cmsys::SystemTools::FileExists((string *)local_1d8);
          if (bVar2) {
            std::__cxx11::string::operator=
                      ((string *)(filename.field_2._M_local_buf + 8),(string *)local_1d8);
          }
          else {
            local_218.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_218.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_218.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_218);
            cmsys::SystemTools::FindProgram(&local_1f8,(string *)local_1d8,&local_218,false);
            std::__cxx11::string::operator=
                      ((string *)(filename.field_2._M_local_buf + 8),(string *)&local_1f8);
            std::__cxx11::string::~string((string *)&local_1f8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_218);
          }
        }
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) != 0) {
          std::__cxx11::string::clear();
        }
        std::__cxx11::string::~string((string *)local_1d8);
      }
      goto LAB_002f915b;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,2);
    bVar2 = std::operator==(pvVar5,"EXT");
    if (bVar2) {
      cmsys::SystemTools::GetFilenameExtension(&local_238,(string *)&other_view);
      std::__cxx11::string::operator=
                ((string *)(filename.field_2._M_local_buf + 8),(string *)&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      goto LAB_002f915b;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,2);
    bVar2 = std::operator==(pvVar5,"NAME_WE");
    if (bVar2) {
      cmsys::SystemTools::GetFilenameWithoutExtension(&local_258,(string *)&other_view);
      std::__cxx11::string::operator=
                ((string *)(filename.field_2._M_local_buf + 8),(string *)&local_258);
      std::__cxx11::string::~string((string *)&local_258);
      goto LAB_002f915b;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,2);
    bVar2 = std::operator==(pvVar5,"LAST_EXT");
    if (bVar2) {
      cmsys::SystemTools::GetFilenameLastExtension(&local_278,(string *)&other_view);
      std::__cxx11::string::operator=
                ((string *)(filename.field_2._M_local_buf + 8),(string *)&local_278);
      std::__cxx11::string::~string((string *)&local_278);
      goto LAB_002f915b;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,2);
    bVar2 = std::operator==(pvVar5,"NAME_WLE");
    if (bVar2) {
      cmsys::SystemTools::GetFilenameWithoutLastExtension
                ((string *)((long)&baseDir.field_2 + 8),(string *)&other_view);
      std::__cxx11::string::operator=
                ((string *)(filename.field_2._M_local_buf + 8),
                 (string *)(baseDir.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(baseDir.field_2._M_local_buf + 8));
      goto LAB_002f915b;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,2);
    bVar2 = std::operator==(pvVar5,"ABSOLUTE");
    if (bVar2) {
LAB_002f8f04:
      psVar7 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
      std::__cxx11::string::string((string *)local_2b8,(string *)psVar7);
      for (local_2bc = 3; uVar8 = (ulong)local_2bc,
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)param_2_local), uVar8 < sVar4; local_2bc = local_2bc + 1) {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local,(ulong)local_2bc);
        bVar2 = std::operator==(pvVar5,"BASE_DIR");
        if (bVar2) {
          local_2bc = local_2bc + 1;
          uVar8 = (ulong)local_2bc;
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)param_2_local);
          if (uVar8 < sVar4) {
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)param_2_local,(ulong)local_2bc);
            std::__cxx11::string::operator=((string *)local_2b8,(string *)pvVar5);
          }
        }
      }
      cmsys::SystemTools::CollapseFullPath(&local_2e0,(string *)&other_view,(string *)local_2b8);
      std::__cxx11::string::operator=
                ((string *)(filename.field_2._M_local_buf + 8),(string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_2e0);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,2);
      bVar2 = std::operator==(pvVar5,"REALPATH");
      if (bVar2) {
        cmsys::SystemTools::GetRealPath
                  ((string *)((long)&err.field_2 + 8),(string *)((long)&filename.field_2 + 8),
                   (string *)0x0);
        std::__cxx11::string::operator=
                  ((string *)(filename.field_2._M_local_buf + 8),
                   (string *)(err.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
      }
      std::__cxx11::string::~string((string *)local_2b8);
      goto LAB_002f915b;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,2);
    bVar2 = std::operator==(pvVar5,"REALPATH");
    if (bVar2) goto LAB_002f8f04;
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,2);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320,
                   "unknown component ",pvVar5);
    cmCommand::SetError(&this->super_cmCommand,(string *)local_320);
    this_local._7_1_ = 0;
    std::__cxx11::string::~string((string *)local_320);
  }
  std::__cxx11::string::~string((string *)local_110);
  std::__cxx11::string::~string((string *)(programArgs.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&other_view);
  std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
LAB_002f93e6:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGetFilenameComponentCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.size() < 3) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // Check and see if the value has been stored in the cache
  // already, if so use that value
  if (args.size() >= 4 && args.back() == "CACHE") {
    const char* cacheValue = this->Makefile->GetDefinition(args.front());
    if (cacheValue && !cmSystemTools::IsNOTFOUND(cacheValue)) {
      return true;
    }
  }

  std::string result;
  std::string filename = args[1];
  if (filename.find("[HKEY") != std::string::npos) {
    // Check the registry as the target application would view it.
    cmSystemTools::KeyWOW64 view = cmSystemTools::KeyWOW64_32;
    cmSystemTools::KeyWOW64 other_view = cmSystemTools::KeyWOW64_64;
    if (this->Makefile->PlatformIs64Bit()) {
      view = cmSystemTools::KeyWOW64_64;
      other_view = cmSystemTools::KeyWOW64_32;
    }
    cmSystemTools::ExpandRegistryValues(filename, view);
    if (filename.find("/registry") != std::string::npos) {
      std::string other = args[1];
      cmSystemTools::ExpandRegistryValues(other, other_view);
      if (other.find("/registry") == std::string::npos) {
        filename = other;
      }
    }
  }
  std::string storeArgs;
  std::string programArgs;
  if (args[2] == "DIRECTORY" || args[2] == "PATH") {
    result = cmSystemTools::GetFilenamePath(filename);
  } else if (args[2] == "NAME") {
    result = cmSystemTools::GetFilenameName(filename);
  } else if (args[2] == "PROGRAM") {
    for (unsigned int i = 2; i < args.size(); ++i) {
      if (args[i] == "PROGRAM_ARGS") {
        i++;
        if (i < args.size()) {
          storeArgs = args[i];
        }
      }
    }

    // First assume the path to the program was specified with no
    // arguments and with no quoting or escaping for spaces.
    // Only bother doing this if there is non-whitespace.
    if (!cmSystemTools::TrimWhitespace(filename).empty()) {
      result = cmSystemTools::FindProgram(filename);
    }

    // If that failed then assume a command-line string was given
    // and split the program part from the rest of the arguments.
    if (result.empty()) {
      std::string program;
      if (cmSystemTools::SplitProgramFromArgs(filename, program,
                                              programArgs)) {
        if (cmSystemTools::FileExists(program)) {
          result = program;
        } else {
          result = cmSystemTools::FindProgram(program);
        }
      }
      if (result.empty()) {
        programArgs.clear();
      }
    }
  } else if (args[2] == "EXT") {
    result = cmSystemTools::GetFilenameExtension(filename);
  } else if (args[2] == "NAME_WE") {
    result = cmSystemTools::GetFilenameWithoutExtension(filename);
  } else if (args[2] == "LAST_EXT") {
    result = cmSystemTools::GetFilenameLastExtension(filename);
  } else if (args[2] == "NAME_WLE") {
    result = cmSystemTools::GetFilenameWithoutLastExtension(filename);
  } else if (args[2] == "ABSOLUTE" || args[2] == "REALPATH") {
    // If the path given is relative, evaluate it relative to the
    // current source directory unless the user passes a different
    // base directory.
    std::string baseDir = this->Makefile->GetCurrentSourceDirectory();
    for (unsigned int i = 3; i < args.size(); ++i) {
      if (args[i] == "BASE_DIR") {
        ++i;
        if (i < args.size()) {
          baseDir = args[i];
        }
      }
    }
    // Collapse the path to its simplest form.
    result = cmSystemTools::CollapseFullPath(filename, baseDir);
    if (args[2] == "REALPATH") {
      // Resolve symlinks if possible
      result = cmSystemTools::GetRealPath(result);
    }
  } else {
    std::string err = "unknown component " + args[2];
    this->SetError(err);
    return false;
  }

  if (args.size() >= 4 && args.back() == "CACHE") {
    if (!programArgs.empty() && !storeArgs.empty()) {
      this->Makefile->AddCacheDefinition(
        storeArgs, programArgs.c_str(), "",
        args[2] == "PATH" ? cmStateEnums::FILEPATH : cmStateEnums::STRING);
    }
    this->Makefile->AddCacheDefinition(
      args.front(), result.c_str(), "",
      args[2] == "PATH" ? cmStateEnums::FILEPATH : cmStateEnums::STRING);
  } else {
    if (!programArgs.empty() && !storeArgs.empty()) {
      this->Makefile->AddDefinition(storeArgs, programArgs.c_str());
    }
    this->Makefile->AddDefinition(args.front(), result.c_str());
  }

  return true;
}